

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_defend(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *ch_00;
  char *txt;
  long lVar4;
  char buf [4608];
  char arg [4608];
  
  txt = buf;
  one_argument(argument,arg);
  iVar3 = get_skill(ch,(int)gsn_defend);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar4 = (long)gsn_defend;
    this = char_data::Class(ch);
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar4 * 0x60 + 0x4ab788 + (long)iVar3 * 2) <= sVar1) {
      if (arg[0] == '\0') {
        if (ch->defending == (CHAR_DATA *)0x0) {
          builtin_strncpy(buf + 0x20,"t now.\n\r",9);
          builtin_strncpy(buf + 0x10,"ding anyone righ",0x10);
          builtin_strncpy(buf,"You aren\'t defen",0x10);
        }
        else {
          sprintf(buf,"You are defending %s.\n\r",ch->defending->name);
          txt = buf;
        }
      }
      else {
        ch_00 = get_char_room(ch,arg);
        if (ch_00 == (CHAR_DATA *)0x0) {
          txt = "They aren\'t here.\n\r";
        }
        else {
          if (ch_00 == ch) {
            send_to_char("You no longer defend anyone.\n\r",ch);
            ch->defending = (CHAR_DATA *)0x0;
            return;
          }
          bVar2 = is_npc(ch_00);
          if (!bVar2) {
            if (ch->defending != (CHAR_DATA *)0x0) {
              act("You stop defending $N.",ch,(void *)0x0,ch->defending,3);
              act("$n stops defending you.",ch,(void *)0x0,ch->defending,2);
            }
            act("You start defending $N.\n\r",ch,(void *)0x0,ch_00,3);
            ch->defending = ch_00;
            act("$n is now defending you.",ch,(void *)0x0,ch_00,2);
            return;
          }
          txt = "They don\'t need to be defended.\n\r";
        }
      }
      goto LAB_002f420b;
    }
  }
  txt = "You aren\'t able to defend other people.\n\r";
LAB_002f420b:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_defend(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_STRING_LENGTH];
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);
	if (get_skill(ch, gsn_defend) == 0 || ch->level < skill_table[gsn_defend].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You aren't able to defend other people.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		if (ch->defending == nullptr)
			sprintf(buf, "You aren't defending anyone right now.\n\r");
		else
			sprintf(buf, "You are defending %s.\n\r", ch->defending->name);

		send_to_char(buf, ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You no longer defend anyone.\n\r", ch);
		ch->defending = nullptr;
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("They don't need to be defended.\n\r", ch);
		return;
	}

	if (ch->defending != nullptr)
	{
		act("You stop defending $N.", ch, 0, ch->defending, TO_CHAR);
		act("$n stops defending you.", ch, 0, ch->defending, TO_VICT);
	}

	act("You start defending $N.\n\r", ch, 0, victim, TO_CHAR);
	ch->defending = victim;
	act("$n is now defending you.", ch, 0, victim, TO_VICT);
}